

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

CTypeID argv2ctype(jit_State *J,TRef tr,cTValue *o)

{
  uint uVar1;
  uint uVar2;
  TRef TVar3;
  int iVar4;
  CTypeID CVar5;
  GCcdata *cd;
  CPState cp;
  CPState CStack_88;
  
  if ((tr & 0x1f000000) == 0x4000000) {
    uVar1 = (o->u32).lo;
    TVar3 = lj_ir_kgc(J,(GCobj *)(ulong)uVar1,IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    CStack_88.L = J->L;
    CStack_88.cts = (CTState *)(ulong)*(uint *)((ulong)((CStack_88.L)->glref).ptr32 + 0x194);
    (CStack_88.cts)->L = CStack_88.L;
    uVar2 = (CStack_88.cts)->top;
    CStack_88.p = (char *)&(((GCobj *)(ulong)uVar1)->gch).metatable;
    CStack_88.param = (TValue *)0x0;
    CStack_88.mode = 0x12;
    CStack_88.srcname = CStack_88.p;
    iVar4 = lj_cparse(&CStack_88);
    if ((iVar4 != 0) || (uVar2 < (CStack_88.cts)->top)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
  }
  else {
    cd = argv2cdata(J,tr,o);
    CStack_88.val.id = (CTypeID)cd->ctypeid;
    if (CStack_88.val.id == 0x15) {
      CVar5 = crec_constructor(J,cd,tr);
      return CVar5;
    }
  }
  return CStack_88.val.id;
}

Assistant:

static CTypeID argv2ctype(jit_State *J, TRef tr, cTValue *o)
{
  if (tref_isstr(tr)) {
    GCstr *s = strV(o);
    CPState cp;
    CTypeID oldtop;
    /* Specialize to the string containing the C type declaration. */
    emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, s));
    cp.L = J->L;
    cp.cts = ctype_cts(J->L);
    oldtop = cp.cts->top;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = NULL;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    if (lj_cparse(&cp) || cp.cts->top > oldtop)  /* Avoid new struct defs. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    return cp.val.id;
  } else {
    GCcdata *cd = argv2cdata(J, tr, o);
    return cd->ctypeid == CTID_CTYPEID ? crec_constructor(J, cd, tr) :
					cd->ctypeid;
  }
}